

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaObjectBuilder::indexOfSlot(QMetaObjectBuilder *this,QByteArray *signature)

{
  bool bVar1;
  MethodType MVar2;
  reference this_00;
  reference pvVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  QMetaMethodBuilderPrivate *method;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *__range1;
  iterator __end1;
  iterator __begin1;
  QByteArray sig;
  __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
  *in_stack_ffffffffffffff68;
  vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QByteArray *in_stack_ffffffffffffff80;
  int local_34;
  __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
  local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::operator_cast_to_char_((QByteArray *)0x3746b4);
  QMetaObject::normalizedSignature(in_RDI);
  local_28._M_current = (QMetaMethodBuilderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._M_current =
       (QMetaMethodBuilderPrivate *)
       std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::begin
                 (in_stack_ffffffffffffff70);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::end
            (in_stack_ffffffffffffff70);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
                        *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) {
      local_34 = -1;
LAB_003747fa:
      QByteArray::~QByteArray((QByteArray *)0x374804);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_34;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
              ::operator*(&local_28);
    MVar2 = QMetaMethodBuilderPrivate::methodType(this_00);
    if ((MVar2 == Slot) &&
       (bVar1 = ::operator==(in_stack_ffffffffffffff80,
                             (QByteArray *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1))
    {
      pvVar3 = std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
               front(in_stack_ffffffffffffff70);
      local_34 = (int)(((long)this_00 - (long)pvVar3) / 0x68);
      goto LAB_003747fa;
    }
    __gnu_cxx::
    __normal_iterator<QMetaMethodBuilderPrivate_*,_std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

int QMetaObjectBuilder::indexOfSlot(const QByteArray &signature)
{
    QByteArray sig = QMetaObject::normalizedSignature(signature);
    for (const auto &method : d->methods) {
        if (method.methodType() == QMetaMethod::Slot && sig == method.signature)
            return int(&method - &d->methods.front());
    }
    return -1;
}